

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib643.c
# Opt level: O0

int once(char *URL,_Bool oldstyle)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  curl_off_t datasize;
  WriteThis pooh2;
  WriteThis pooh;
  curl_mimepart *part;
  curl_mime *mime;
  CURLcode res;
  CURL *curl;
  _Bool oldstyle_local;
  char *URL_local;
  
  pooh2.sizeleft = (curl_off_t)data;
  lVar1 = curl_easy_init();
  if (lVar1 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
    URL_local._4_4_ = 0x7e;
  }
  else {
    lVar2 = curl_mime_init(lVar1);
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_mime_init() failed\n");
      curl_easy_cleanup(lVar1);
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      lVar3 = curl_mime_addpart(lVar2);
      if (lVar3 == 0) {
        curl_mfprintf(_stderr,"curl_mime_addpart(1) failed\n");
        curl_mime_free(lVar2);
        curl_easy_cleanup(lVar1);
        curl_global_cleanup();
        URL_local._4_4_ = 0x7e;
      }
      else {
        if (oldstyle) {
          mime._4_4_ = curl_mime_name(lVar3,"sendfile");
          if (mime._4_4_ == 0) {
            mime._4_4_ = curl_mime_data_cb(lVar3,0xffffffffffffffff,read_callback,0,0,
                                           &pooh2.sizeleft);
          }
          if (mime._4_4_ == 0) {
            mime._4_4_ = curl_mime_filename(lVar3,"postit2.c");
          }
        }
        else {
          mime._4_4_ = curl_mime_name(lVar3,"sendfile alternative");
          if (mime._4_4_ == 0) {
            mime._4_4_ = curl_mime_data_cb(lVar3,0xffffffffffffffff,read_callback,0,0,
                                           &pooh2.sizeleft);
          }
          if (mime._4_4_ == 0) {
            mime._4_4_ = curl_mime_filename(lVar3,"file name 2");
          }
        }
        if (mime._4_4_ != 0) {
          uVar4 = curl_easy_strerror(mime._4_4_);
          curl_mprintf("curl_mime_xxx(1) = %s\n",uVar4);
        }
        datasize = (curl_off_t)data;
        pooh2.readptr = (char *)0xffffffffffffffff;
        lVar3 = curl_mime_addpart(lVar2);
        if (lVar3 == 0) {
          curl_mfprintf(_stderr,"curl_mime_addpart(2) failed\n");
          curl_mime_free(lVar2);
          curl_easy_cleanup(lVar1);
          curl_global_cleanup();
          URL_local._4_4_ = 0x7e;
        }
        else {
          mime._4_4_ = curl_mime_name(lVar3,"callbackdata");
          if (mime._4_4_ == 0) {
            mime._4_4_ = curl_mime_data_cb(lVar3,0xffffffffffffffff,read_callback,0,0,&datasize);
          }
          if (mime._4_4_ != 0) {
            uVar4 = curl_easy_strerror(mime._4_4_);
            curl_mprintf("curl_mime_xxx(2) = %s\n",uVar4);
          }
          lVar3 = curl_mime_addpart(lVar2);
          if (lVar3 == 0) {
            curl_mfprintf(_stderr,"curl_mime_addpart(3) failed\n");
            curl_mime_free(lVar2);
            curl_easy_cleanup(lVar1);
            curl_global_cleanup();
            URL_local._4_4_ = 0x7e;
          }
          else {
            mime._4_4_ = curl_mime_name(lVar3,"filename");
            if (mime._4_4_ == 0) {
              mime._4_4_ = curl_mime_data(lVar3,"postit2.c",0xffffffffffffffff);
            }
            if (mime._4_4_ != 0) {
              uVar4 = curl_easy_strerror(mime._4_4_);
              curl_mprintf("curl_mime_xxx(3) = %s\n",uVar4);
            }
            lVar3 = curl_mime_addpart(lVar2);
            if (lVar3 == 0) {
              curl_mfprintf(_stderr,"curl_mime_addpart(4) failed\n");
              curl_mime_free(lVar2);
              curl_easy_cleanup(lVar1);
              curl_global_cleanup();
              URL_local._4_4_ = 0x7e;
            }
            else {
              mime._4_4_ = curl_mime_name(lVar3,"submit");
              if (mime._4_4_ == 0) {
                mime._4_4_ = curl_mime_data(lVar3,"send",0xffffffffffffffff);
              }
              if (mime._4_4_ != 0) {
                uVar4 = curl_easy_strerror(mime._4_4_);
                curl_mprintf("curl_mime_xxx(4) = %s\n",uVar4);
              }
              lVar3 = curl_mime_addpart(lVar2);
              if (lVar3 == 0) {
                curl_mfprintf(_stderr,"curl_mime_addpart(5) failed\n");
                curl_mime_free(lVar2);
                curl_easy_cleanup(lVar1);
                curl_global_cleanup();
                URL_local._4_4_ = 0x7e;
              }
              else {
                mime._4_4_ = curl_mime_name(lVar3,"somename");
                if (mime._4_4_ == 0) {
                  mime._4_4_ = curl_mime_filename(lVar3,"somefile.txt");
                }
                if (mime._4_4_ == 0) {
                  mime._4_4_ = curl_mime_data(lVar3,"blah blah",9);
                }
                if (mime._4_4_ != 0) {
                  uVar4 = curl_easy_strerror(mime._4_4_);
                  curl_mprintf("curl_mime_xxx(5) = %s\n",uVar4);
                }
                mime._4_4_ = curl_easy_setopt(lVar1,0x2712,URL);
                if ((((mime._4_4_ == 0) &&
                     (mime._4_4_ = curl_easy_setopt(lVar1,0x281d,lVar2), mime._4_4_ == 0)) &&
                    (mime._4_4_ = curl_easy_setopt(lVar1,0x29,1), mime._4_4_ == 0)) &&
                   (mime._4_4_ = curl_easy_setopt(lVar1,0x2a,1), mime._4_4_ == 0)) {
                  mime._4_4_ = curl_easy_perform(lVar1);
                }
                curl_easy_cleanup(lVar1);
                curl_mime_free(lVar2);
                URL_local._4_4_ = mime._4_4_;
              }
            }
          }
        }
      }
    }
  }
  return URL_local._4_4_;
}

Assistant:

static int once(char *URL, bool oldstyle)
{
  CURL *curl;
  CURLcode res = CURLE_OK;

  curl_mime *mime = NULL;
  curl_mimepart *part = NULL;
  struct WriteThis pooh;
  struct WriteThis pooh2;
  curl_off_t datasize = -1;

  pooh.readptr = data;
#ifndef LIB645
  datasize = (curl_off_t)strlen(data);
#endif
  pooh.sizeleft = datasize;

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(1) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* Fill in the file upload part */
  if(oldstyle) {
    res = curl_mime_name(part, "sendfile");
    if(!res)
      res = curl_mime_data_cb(part, datasize, read_callback,
                              NULL, NULL, &pooh);
    if(!res)
      res = curl_mime_filename(part, "postit2.c");
  }
  else {
    /* new style */
    res = curl_mime_name(part, "sendfile alternative");
    if(!res)
      res = curl_mime_data_cb(part, datasize, read_callback,
                              NULL, NULL, &pooh);
    if(!res)
      res = curl_mime_filename(part, "file name 2");
  }

  if(res)
    printf("curl_mime_xxx(1) = %s\n", curl_easy_strerror(res));

  /* Now add the same data with another name and make it not look like
     a file upload but still using the callback */

  pooh2.readptr = data;
#ifndef LIB645
  datasize = (curl_off_t)strlen(data);
#endif
  pooh2.sizeleft = datasize;

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(2) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  /* Fill in the file upload part */
  res = curl_mime_name(part, "callbackdata");
  if(!res)
    res = curl_mime_data_cb(part, datasize, read_callback,
                            NULL, NULL, &pooh2);

  if(res)
    printf("curl_mime_xxx(2) = %s\n", curl_easy_strerror(res));

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(3) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* Fill in the filename field */
  res = curl_mime_name(part, "filename");
  if(!res)
    res = curl_mime_data(part,
#ifdef CURL_DOES_CONVERSIONS
                         /* ASCII representation with escape
                            sequences for non-ASCII platforms */
                         "\x70\x6f\x73\x74\x69\x74\x32\x2e\x63",
#else
                          "postit2.c",
#endif
                          CURL_ZERO_TERMINATED);

  if(res)
    printf("curl_mime_xxx(3) = %s\n", curl_easy_strerror(res));

  /* Fill in a submit field too */
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(4) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  res = curl_mime_name(part, "submit");
  if(!res)
    res = curl_mime_data(part,
#ifdef CURL_DOES_CONVERSIONS
                         /* ASCII representation with escape
                            sequences for non-ASCII platforms */
                         "\x73\x65\x6e\x64",
#else
                          "send",
#endif
                          CURL_ZERO_TERMINATED);

  if(res)
    printf("curl_mime_xxx(4) = %s\n", curl_easy_strerror(res));

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(5) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  res = curl_mime_name(part, "somename");
  if(!res)
    res = curl_mime_filename(part, "somefile.txt");
  if(!res)
    res = curl_mime_data(part, "blah blah", 9);

  if(res)
    printf("curl_mime_xxx(5) = %s\n", curl_easy_strerror(res));

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* send a multi-part mimepost */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mimepost structure */
  curl_mime_free(mime);

  return res;
}